

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWwindow *window;
  long lVar3;
  _GLFWfbconfig *p_Var4;
  _GLFWfbconfig *p_Var5;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig local_3f8;
  _GLFWfbconfig local_3c0;
  _GLFWwndconfig local_378;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/window.c",
                  0xaa,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (width < 0) {
    __assert_fail("width >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/window.c",
                  0xab,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (height < 0) {
    __assert_fail("height >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/src/window.c",
                  0xac,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfw.initialized != 0) {
    if (width == 0 || height == 0) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,height);
      return (GLFWwindow *)0x0;
    }
    p_Var4 = &_glfw.hints.framebuffer;
    p_Var5 = &local_3c0;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      iVar2 = p_Var4->greenBits;
      p_Var5->redBits = p_Var4->redBits;
      p_Var5->greenBits = iVar2;
      p_Var4 = (_GLFWfbconfig *)&p_Var4->blueBits;
      p_Var5 = (_GLFWfbconfig *)&p_Var5->blueBits;
    }
    local_3f8._48_8_ = _glfw.hints.context._48_8_;
    local_3f8._32_8_ = _glfw.hints.context._32_8_;
    local_3f8.share = _glfw.hints.context.share;
    local_3f8._16_8_ = _glfw.hints.context._16_8_;
    local_3f8._24_8_ = _glfw.hints.context._24_8_;
    local_3f8._0_8_ = _glfw.hints.context._0_8_;
    local_3f8._8_8_ = _glfw.hints.context._8_8_;
    memcpy(&local_378,&_glfw.hints.window,0x348);
    local_3f8.share = (_GLFWwindow *)share;
    local_378.width = width;
    local_378.height = height;
    local_378.title = title;
    GVar1 = _glfwIsValidContextConfig(&local_3f8);
    if (GVar1 != 0) {
      window = (_GLFWwindow *)_glfw_calloc(1,0xbe8);
      window->next = _glfw.windowListHead;
      _glfw.windowListHead = window;
      (window->videoMode).width = width;
      (window->videoMode).height = height;
      (window->videoMode).redBits = local_3c0.redBits;
      (window->videoMode).greenBits = local_3c0.greenBits;
      (window->videoMode).blueBits = local_3c0.blueBits;
      (window->videoMode).refreshRate = _glfw.hints.refreshRate;
      window->monitor = (_GLFWmonitor *)monitor;
      window->resizable = local_378.resizable;
      window->decorated = local_378.decorated;
      window->autoIconify = local_378.autoIconify;
      window->floating = local_378.floating;
      window->focusOnShow = local_378.focusOnShow;
      window->mousePassthrough = local_378.mousePassthrough;
      window->cursorMode = 0x34001;
      window->doublebuffer = local_3c0.doublebuffer;
      window->minwidth = -1;
      window->minheight = -1;
      window->maxwidth = -1;
      window->maxheight = -1;
      window->numer = -1;
      window->denom = -1;
      iVar2 = (*_glfw.platform.createWindow)(window,&local_378,&local_3f8,&local_3c0);
      if ((iVar2 != 0) &&
         ((local_3f8.client == 0 ||
          (GVar1 = _glfwRefreshContextAttribs(window,&local_3f8), GVar1 != 0)))) {
        if (local_378.mousePassthrough != 0) {
          (*_glfw.platform.setWindowMousePassthrough)(window,1);
        }
        if (window->monitor != (_GLFWmonitor *)0x0) {
          if (local_378.centerCursor == 0) {
            return (GLFWwindow *)window;
          }
          _glfwCenterCursorInContentArea(window);
          return (GLFWwindow *)window;
        }
        if (local_378.visible == 0) {
          return (GLFWwindow *)window;
        }
        (*_glfw.platform.showWindow)(window);
        if (local_378.focused == 0) {
          return (GLFWwindow *)window;
        }
        (*_glfw.platform.focusWindow)(window);
        return (GLFWwindow *)window;
      }
      glfwDestroyWindow((GLFWwindow *)window);
    }
    return (GLFWwindow *)0x0;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;

    assert(title != NULL);
    assert(width >= 0);
    assert(height >= 0);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = _glfw_calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor          = (_GLFWmonitor*) monitor;
    window->resizable        = wndconfig.resizable;
    window->decorated        = wndconfig.decorated;
    window->autoIconify      = wndconfig.autoIconify;
    window->floating         = wndconfig.floating;
    window->focusOnShow      = wndconfig.focusOnShow;
    window->mousePassthrough = wndconfig.mousePassthrough;
    window->cursorMode       = GLFW_CURSOR_NORMAL;

    window->doublebuffer = fbconfig.doublebuffer;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Open the actual window and create its context
    if (!_glfw.platform.createWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        if (!_glfwRefreshContextAttribs(window, &ctxconfig))
        {
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }
    }

    if (wndconfig.mousePassthrough)
        _glfw.platform.setWindowMousePassthrough(window, GLFW_TRUE);

    if (window->monitor)
    {
        if (wndconfig.centerCursor)
            _glfwCenterCursorInContentArea(window);
    }
    else
    {
        if (wndconfig.visible)
        {
            _glfw.platform.showWindow(window);
            if (wndconfig.focused)
                _glfw.platform.focusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}